

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

U32 ZSTD_insertAndFindFirstIndex(ZSTD_matchState_t *ms,BYTE *ip)

{
  uint uVar1;
  U32 h_00;
  uint uVar2;
  U32 *pUVar3;
  U32 *pUVar4;
  BYTE *pBVar5;
  uint uVar6;
  BYTE *p;
  ZSTD_compressionParameters *cParams;
  BYTE *ip_local;
  ZSTD_matchState_t *ms_local;
  size_t h;
  U32 idx;
  U32 target;
  BYTE *base;
  U32 chainMask;
  U32 *chainTable;
  U32 hashLog;
  U32 *hashTable;
  size_t local_28;
  size_t local_10;
  
  uVar1 = (ms->cParams).minMatch;
  pUVar3 = ms->hashTable;
  h_00 = (ms->cParams).hashLog;
  pUVar4 = ms->chainTable;
  uVar2 = (ms->cParams).chainLog;
  pBVar5 = (ms->window).base;
  uVar6 = (int)ip - (int)pBVar5;
  for (h._0_4_ = ms->nextToUpdate; (U32)h < uVar6; h._0_4_ = (U32)h + 1) {
    p = pBVar5 + (U32)h;
    switch(uVar1) {
    default:
      local_10 = ZSTD_hash4Ptr(p,h_00);
      break;
    case 5:
      local_10 = ZSTD_hash5Ptr(p,h_00);
      break;
    case 6:
      local_10 = ZSTD_hash6Ptr(p,h_00);
      break;
    case 7:
      local_10 = ZSTD_hash7Ptr(p,h_00);
      break;
    case 8:
      local_10 = ZSTD_hash8Ptr(p,h_00);
    }
    pUVar4[(U32)h & (1 << ((byte)uVar2 & 0x1f)) - 1U] = pUVar3[local_10];
    pUVar3[local_10] = (U32)h;
  }
  ms->nextToUpdate = uVar6;
  switch(uVar1) {
  default:
    local_28 = ZSTD_hash4Ptr(ip,h_00);
    break;
  case 5:
    local_28 = ZSTD_hash5Ptr(ip,h_00);
    break;
  case 6:
    local_28 = ZSTD_hash6Ptr(ip,h_00);
    break;
  case 7:
    local_28 = ZSTD_hash7Ptr(ip,h_00);
    break;
  case 8:
    local_28 = ZSTD_hash8Ptr(ip,h_00);
  }
  return pUVar3[local_28];
}

Assistant:

U32 ZSTD_insertAndFindFirstIndex(ZSTD_matchState_t* ms, const BYTE* ip) {
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    return ZSTD_insertAndFindFirstIndex_internal(ms, cParams, ip, ms->cParams.minMatch);
}